

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Writer.cpp
# Opt level: O2

void __thiscall
adios2::core::engine::BP4Writer::WriteCollectiveMetadataFile(BP4Writer *this,bool isFinal)

{
  BP4Serializer *this_00;
  unordered_map<unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
  *this_01;
  BufferSTL *this_02;
  code *pcVar1;
  pointer pbVar2;
  _func_int **pp_Var3;
  unsigned_long uVar4;
  long lVar5;
  long lVar6;
  unsigned_long uVar7;
  long lVar8;
  long lVar9;
  unsigned_long uVar10;
  long lVar11;
  pointer puVar12;
  int iVar13;
  uint64_t currentTimeStamp;
  mapped_type *pmVar14;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *p_Var15;
  mapped_type *pmVar16;
  _func_int *p_Var17;
  unsigned_long *t;
  pointer puVar18;
  BP4Writer *this_03;
  size_t i;
  ulong uVar19;
  __node_base *p_Var20;
  long lVar21;
  key_type local_a8;
  BP4Writer *local_a0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> timeSteps;
  ScopedTimer __var2633;
  string local_50;
  
  local_a0 = this;
  if (WriteCollectiveMetadataFile(bool)::__var633 == '\0') {
    iVar13 = __cxa_guard_acquire(&WriteCollectiveMetadataFile(bool)::__var633);
    if (iVar13 != 0) {
      WriteCollectiveMetadataFile::__var633 =
           (void *)ps_timer_create_("BP4Writer::WriteCollectiveMetadataFile");
      __cxa_guard_release(&WriteCollectiveMetadataFile(bool)::__var633);
      this = local_a0;
    }
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer
            (&__var2633,WriteCollectiveMetadataFile::__var633);
  p_Var17 = (this->m_BP4Serializer).super_BP4Base._vptr_BP4Base[-3];
  if ((!isFinal) ||
     (*(long *)(p_Var17 + 0x1a0 + (long)&(this->m_BP4Serializer).super_BP4Base._vptr_BP4Base) != 0))
  {
    this_00 = &this->m_BP4Serializer;
    adios2::format::BP4Serializer::AggregateCollectiveMetadata
              (this_00,&(this->super_Engine).m_Comm,
               (BufferSTL *)
               (p_Var17 + 0x88 + (long)&(this->m_BP4Serializer).super_BP4Base._vptr_BP4Base),true);
    p_Var17 = (this_00->super_BP4Base)._vptr_BP4Base[-3];
    if (*(int *)(p_Var17 + 0x10 + (long)&(this->m_BP4Serializer).super_BP4Base._vptr_BP4Base) == 0)
    {
      transportman::TransportMan::WriteFiles
                (&this->m_FileMetadataManager,
                 *(char **)(p_Var17 + 200 +
                           (long)&(this->m_BP4Serializer).super_BP4Base._vptr_BP4Base),
                 *(size_t *)
                  (p_Var17 + 0xb8 + (long)&(this->m_BP4Serializer).super_BP4Base._vptr_BP4Base),-1);
      transportman::TransportMan::FlushFiles(&this->m_FileMetadataManager,-1);
      if (this->m_DrainBB == true) {
        lVar21 = 0;
        for (uVar19 = 0;
            pbVar2 = (this->m_MetadataFileNames).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
            uVar19 < (ulong)((long)(this->m_MetadataFileNames).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5);
            uVar19 = uVar19 + 1) {
          burstbuffer::FileDrainer::AddOperationCopy
                    (&(this->m_FileDrainer).super_FileDrainer,
                     (string *)((long)&(pbVar2->_M_dataplus)._M_p + lVar21),
                     (string *)
                     ((long)&(((this->m_DrainMetadataFileNames).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                     lVar21),*(size_t *)
                              ((this->m_BP4Serializer).super_BP4Base._vptr_BP4Base[-3] + 0xb8 +
                              (long)&(this->m_BP4Serializer).super_BP4Base._vptr_BP4Base));
          lVar21 = lVar21 + 0x20;
        }
      }
      currentTimeStamp = time((time_t *)0x0);
      timeSteps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      timeSteps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      timeSteps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      this_01 = &(this->m_BP4Serializer).super_BP4Base.m_MetadataIndexTable;
      local_a8 = (key_type)
                 *(int *)((this->m_BP4Serializer).super_BP4Base._vptr_BP4Base[-3] + 0x10 +
                         (long)&(this->m_BP4Serializer).super_BP4Base._vptr_BP4Base);
      pmVar14 = std::__detail::
                _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)this_01,&local_a8);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                (&timeSteps,(pmVar14->_M_h)._M_element_count);
      local_a8 = (key_type)
                 *(int *)((this_00->super_BP4Base)._vptr_BP4Base[-3] + 0x10 +
                         (long)&(this->m_BP4Serializer).super_BP4Base._vptr_BP4Base);
      pmVar14 = std::__detail::
                _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)this_01,&local_a8);
      p_Var20 = &(pmVar14->_M_h)._M_before_begin;
      while (p_Var20 = p_Var20->_M_nxt, p_Var20 != (__node_base *)0x0) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (&timeSteps,(value_type_conflict9 *)(p_Var20 + 1));
      }
      std::
      __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (timeSteps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start,
                 timeSteps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish);
      puVar18 = timeSteps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish;
      puVar12 = timeSteps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      std::__cxx11::string::string((string *)&local_50,"BP4 Index Table",(allocator *)&local_a8);
      this_02 = &(this->m_BP4Serializer).super_BP4Base.m_MetadataIndex;
      adios2::format::BufferSTL::Resize
                (this_02,((long)puVar18 - (long)puVar12) * 8 + 0x40,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      puVar12 = timeSteps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (puVar18 = timeSteps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start; puVar18 != puVar12;
          puVar18 = puVar18 + 1) {
        local_a8 = (key_type)
                   *(int *)((this->m_BP4Serializer).super_BP4Base._vptr_BP4Base[-3] + 0x10 +
                           (long)&(this->m_BP4Serializer).super_BP4Base._vptr_BP4Base);
        p_Var15 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)std::__detail::
                     _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)this_01,&local_a8);
        pmVar16 = std::__detail::
                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[](p_Var15,puVar18);
        pp_Var3 = (this->m_BP4Serializer).super_BP4Base._vptr_BP4Base;
        p_Var17 = pp_Var3[-3];
        lVar21 = *(long *)(p_Var17 + 0x1f8 +
                          (long)&(this->m_BP4Serializer).super_BP4Base._vptr_BP4Base);
        uVar4 = *(pmVar16->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        lVar5 = *(long *)(p_Var17 + 0x20 +
                         (long)&(this->m_BP4Serializer).super_BP4Base._vptr_BP4Base);
        local_a8 = (key_type)
                   *(int *)(pp_Var3[-3] + 0x10 +
                           (long)&(this->m_BP4Serializer).super_BP4Base._vptr_BP4Base);
        p_Var15 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)std::__detail::
                     _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)this_01,&local_a8);
        pmVar16 = std::__detail::
                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[](p_Var15,puVar18);
        pp_Var3 = (this->m_BP4Serializer).super_BP4Base._vptr_BP4Base;
        p_Var17 = pp_Var3[-3];
        lVar6 = *(long *)(p_Var17 + 0x1f8 +
                         (long)&(this->m_BP4Serializer).super_BP4Base._vptr_BP4Base);
        uVar7 = (pmVar16->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                .super__Vector_impl_data._M_start[1];
        lVar8 = *(long *)(p_Var17 + 0x20 +
                         (long)&(this->m_BP4Serializer).super_BP4Base._vptr_BP4Base);
        local_a8 = (key_type)
                   *(int *)(pp_Var3[-3] + 0x10 +
                           (long)&(this->m_BP4Serializer).super_BP4Base._vptr_BP4Base);
        p_Var15 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)std::__detail::
                     _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)this_01,&local_a8);
        pmVar16 = std::__detail::
                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[](p_Var15,puVar18);
        pp_Var3 = (local_a0->m_BP4Serializer).super_BP4Base._vptr_BP4Base;
        p_Var17 = pp_Var3[-3];
        lVar9 = *(long *)(p_Var17 + 0x1f8 +
                         (long)&(local_a0->m_BP4Serializer).super_BP4Base._vptr_BP4Base);
        uVar10 = (pmVar16->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start[2];
        lVar11 = *(long *)(p_Var17 + 0x20 +
                          (long)&(local_a0->m_BP4Serializer).super_BP4Base._vptr_BP4Base);
        local_a8 = (key_type)
                   *(int *)(pp_Var3[-3] + 0x10 +
                           (long)&(local_a0->m_BP4Serializer).super_BP4Base._vptr_BP4Base);
        p_Var15 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)std::__detail::
                     _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)this_01,&local_a8);
        pmVar16 = std::__detail::
                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[](p_Var15,puVar18);
        pp_Var3 = (local_a0->m_BP4Serializer).super_BP4Base._vptr_BP4Base;
        p_Var17 = pp_Var3[-3];
        this_03 = (BP4Writer *)
                  (*(long *)(p_Var17 + 0x1f8 +
                            (long)&(local_a0->m_BP4Serializer).super_BP4Base._vptr_BP4Base) +
                   (pmVar16->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start[3] +
                  *(long *)(p_Var17 + 0x20 +
                           (long)&(local_a0->m_BP4Serializer).super_BP4Base._vptr_BP4Base));
        PopulateMetadataIndexFileContent
                  (this_03,this_02,*puVar18,
                   (long)*(int *)(pp_Var3[-3] + 0x10 +
                                 (long)&(local_a0->m_BP4Serializer).super_BP4Base._vptr_BP4Base),
                   lVar21 + uVar4 + lVar5,lVar6 + uVar7 + lVar8,lVar9 + uVar10 + lVar11,
                   (uint64_t)this_03,currentTimeStamp);
        this = local_a0;
      }
      transportman::TransportMan::WriteFiles
                (&this->m_FileMetadataIndexManager,
                 (this->m_BP4Serializer).super_BP4Base.m_MetadataIndex.m_Buffer.
                 super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                 _M_start,(this->m_BP4Serializer).super_BP4Base.m_MetadataIndex.super_Buffer.
                          m_Position,-1);
      transportman::TransportMan::FlushFiles(&this->m_FileMetadataIndexManager,-1);
      p_Var17 = (this->m_BP4Serializer).super_BP4Base._vptr_BP4Base[-3];
      pcVar1 = p_Var17 + 0x1f8 + (long)&(this->m_BP4Serializer).super_BP4Base._vptr_BP4Base;
      *(long *)pcVar1 =
           *(long *)pcVar1 +
           *(long *)(p_Var17 + 0xb8 + (long)&(this->m_BP4Serializer).super_BP4Base._vptr_BP4Base);
      if (this->m_DrainBB == true) {
        lVar21 = 0;
        for (uVar19 = 0;
            uVar19 < (ulong)((long)(this->m_MetadataIndexFileNames).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->m_MetadataIndexFileNames).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5);
            uVar19 = uVar19 + 1) {
          burstbuffer::FileDrainer::AddOperationWrite
                    (&(this->m_FileDrainer).super_FileDrainer,
                     (string *)
                     ((long)&(((this->m_DrainMetadataIndexFileNames).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                     lVar21),(this->m_BP4Serializer).super_BP4Base.m_MetadataIndex.super_Buffer.
                             m_Position,
                     (this->m_BP4Serializer).super_BP4Base.m_MetadataIndex.m_Buffer.
                     super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
                     ._M_start);
          lVar21 = lVar21 + 0x20;
        }
      }
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&timeSteps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      p_Var17 = (this_00->super_BP4Base)._vptr_BP4Base[-3];
    }
    adios2::format::BPBase::ResetBuffer
              ((BPBase *)((long)&(this_00->super_BP4Base)._vptr_BP4Base + (long)p_Var17),
               (Buffer *)
               (p_Var17 + 0x48 + (long)&(this_00->super_BP4Base).m_MetadataIndex.super_Buffer),true,
               true);
    adios2::format::BPBase::ResetBuffer
              ((BPBase *)
               ((long)&(this_00->super_BP4Base)._vptr_BP4Base +
               (long)(this->m_BP4Serializer).super_BP4Base._vptr_BP4Base[-3]),
               &(this->m_BP4Serializer).super_BP4Base.m_MetadataIndex.super_Buffer,true,true);
    adios2::format::BP4Serializer::ResetMetadataIndexTable(this_00);
    adios2::format::BP4Serializer::ResetAllIndices(this_00);
  }
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&__var2633);
  return;
}

Assistant:

void BP4Writer::WriteCollectiveMetadataFile(const bool isFinal)
{

    PERFSTUBS_SCOPED_TIMER("BP4Writer::WriteCollectiveMetadataFile");

    if (isFinal && m_BP4Serializer.m_MetadataSet.DataPGCount == 0)
    {
        // If data pg count is zero, it means all metadata
        // has already been written, don't need to write it again.
        return;
    }
    m_BP4Serializer.AggregateCollectiveMetadata(m_Comm, m_BP4Serializer.m_Metadata, true);

    if (m_BP4Serializer.m_RankMPI == 0)
    {

        m_FileMetadataManager.WriteFiles(m_BP4Serializer.m_Metadata.m_Buffer.data(),
                                         m_BP4Serializer.m_Metadata.m_Position);
        m_FileMetadataManager.FlushFiles();

        if (m_DrainBB)
        {
            for (size_t i = 0; i < m_MetadataFileNames.size(); ++i)
            {
                m_FileDrainer.AddOperationCopy(m_MetadataFileNames[i], m_DrainMetadataFileNames[i],
                                               m_BP4Serializer.m_Metadata.m_Position);
            }
        }

        std::time_t currentTimeStamp = std::time(nullptr);

        std::vector<size_t> timeSteps;
        timeSteps.reserve(m_BP4Serializer.m_MetadataIndexTable[m_BP4Serializer.m_RankMPI].size());
        for (auto const &pair : m_BP4Serializer.m_MetadataIndexTable[m_BP4Serializer.m_RankMPI])
        {
            timeSteps.push_back(pair.first);
        }
        std::sort(timeSteps.begin(), timeSteps.end());

        size_t rowsInMetadataIndexTable = timeSteps.size() + 1;
        m_BP4Serializer.m_MetadataIndex.Resize(rowsInMetadataIndexTable * 64, "BP4 Index Table");
        for (auto const &t : timeSteps)
        {
            const uint64_t pgIndexStartMetadataFile =
                m_BP4Serializer.m_MetadataIndexTable[m_BP4Serializer.m_RankMPI][t][0] +
                m_BP4Serializer.m_MetadataSet.MetadataFileLength +
                m_BP4Serializer.m_PreMetadataFileLength;
            const uint64_t varIndexStartMetadataFile =
                m_BP4Serializer.m_MetadataIndexTable[m_BP4Serializer.m_RankMPI][t][1] +
                m_BP4Serializer.m_MetadataSet.MetadataFileLength +
                m_BP4Serializer.m_PreMetadataFileLength;
            const uint64_t attrIndexStartMetadataFile =
                m_BP4Serializer.m_MetadataIndexTable[m_BP4Serializer.m_RankMPI][t][2] +
                m_BP4Serializer.m_MetadataSet.MetadataFileLength +
                m_BP4Serializer.m_PreMetadataFileLength;
            const uint64_t currentStepEndPosMetadataFile =
                m_BP4Serializer.m_MetadataIndexTable[m_BP4Serializer.m_RankMPI][t][3] +
                m_BP4Serializer.m_MetadataSet.MetadataFileLength +
                m_BP4Serializer.m_PreMetadataFileLength;
            PopulateMetadataIndexFileContent(m_BP4Serializer.m_MetadataIndex, t,
                                             m_BP4Serializer.m_RankMPI, pgIndexStartMetadataFile,
                                             varIndexStartMetadataFile, attrIndexStartMetadataFile,
                                             currentStepEndPosMetadataFile, currentTimeStamp);
        }

        m_FileMetadataIndexManager.WriteFiles(m_BP4Serializer.m_MetadataIndex.m_Buffer.data(),
                                              m_BP4Serializer.m_MetadataIndex.m_Position);
        m_FileMetadataIndexManager.FlushFiles();

        m_BP4Serializer.m_MetadataSet.MetadataFileLength += m_BP4Serializer.m_Metadata.m_Position;

        if (m_DrainBB)
        {
            for (size_t i = 0; i < m_MetadataIndexFileNames.size(); ++i)
            {
                m_FileDrainer.AddOperationWrite(m_DrainMetadataIndexFileNames[i],
                                                m_BP4Serializer.m_MetadataIndex.m_Position,
                                                m_BP4Serializer.m_MetadataIndex.m_Buffer.data());
            }
        }
    }
    /*Clear the local indices buffer at the end of each step*/
    m_BP4Serializer.ResetBuffer(m_BP4Serializer.m_Metadata, true, true);

    /* clear the metadata index buffer*/
    m_BP4Serializer.ResetBuffer(m_BP4Serializer.m_MetadataIndex, true, true);

    /* reset the metadata index table*/
    m_BP4Serializer.ResetMetadataIndexTable();
    m_BP4Serializer.ResetAllIndices();
}